

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_divuw_m68k(CPUM68KState_conflict *env,int destr,uint32_t den)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uintptr_t unaff_retaddr;
  
  if (den != 0) {
    uVar1 = env->dregs[destr];
    uVar2 = (ulong)uVar1 / (ulong)den;
    uVar5 = 0;
    env->cc_c = 0;
    uVar3 = (uint)uVar2;
    if (uVar3 < 0x10000) {
      env->dregs[destr] = uVar1 % den << 0x10 | uVar3;
      uVar4 = (uint32_t)(short)uVar2;
      env->cc_n = uVar4;
    }
    else {
      uVar4 = 1;
      uVar5 = 0xffffffff;
    }
    env->cc_v = uVar5;
    env->cc_z = uVar4;
    return;
  }
  *(undefined4 *)(env[-3].fregs + 2) = 5;
  cpu_loop_exit_restore_m68k((CPUState *)(env[-0x40].fregs + 2),unaff_retaddr);
}

Assistant:

void HELPER(divuw)(CPUM68KState *env, int destr, uint32_t den)
{
    uint32_t num = env->dregs[destr];
    uint32_t quot, rem;

    if (den == 0) {
        raise_exception_ra(env, EXCP_DIV0, GETPC());
    }
    quot = num / den;
    rem = num % den;

    env->cc_c = 0; /* always cleared, even if overflow */
    if (quot > 0xffff) {
        env->cc_v = -1;
        /*
         * real 68040 keeps N and unset Z on overflow,
         * whereas documentation says "undefined"
         */
        env->cc_z = 1;
        return;
    }
    env->dregs[destr] = deposit32(quot, 16, 16, rem);
    env->cc_z = (int16_t)quot;
    env->cc_n = (int16_t)quot;
    env->cc_v = 0;
}